

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O1

int __thiscall fmt::v6::internal::bigint::divmod_assign(bigint *this,bigint *divisor)

{
  uint *puVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  uint uVar8;
  
  iVar3 = compare(this,divisor);
  if (iVar3 < 0) {
    iVar3 = 0;
  }
  else {
    uVar8 = this->exp_ - divisor->exp_;
    if (uVar8 != 0 && divisor->exp_ <= this->exp_) {
      iVar3 = (int)(this->bigits_).super_buffer<unsigned_int>.size_;
      if ((this->bigits_).super_buffer<unsigned_int>.capacity_ < (ulong)(uVar8 + iVar3)) {
        (**(this->bigits_).super_buffer<unsigned_int>._vptr_buffer)(this);
      }
      (this->bigits_).super_buffer<unsigned_int>.size_ = (ulong)(uVar8 + iVar3);
      if (0 < iVar3) {
        puVar1 = (this->bigits_).super_buffer<unsigned_int>.ptr_;
        lVar7 = (long)(int)(uVar8 + iVar3 + -1);
        lVar5 = (ulong)(iVar3 - 1) + 1;
        do {
          puVar1[lVar7] = puVar1[lVar5 + -1];
          lVar7 = lVar7 + -1;
          lVar6 = lVar5 + -1;
          bVar2 = 0 < lVar5;
          lVar5 = lVar6;
        } while (lVar6 != 0 && bVar2);
      }
      memset((this->bigits_).super_buffer<unsigned_int>.ptr_,0,(ulong)uVar8 << 2);
      this->exp_ = this->exp_ - uVar8;
    }
    iVar3 = 0;
    do {
      subtract_aligned(this,divisor);
      iVar3 = iVar3 + 1;
      iVar4 = compare(this,divisor);
    } while (-1 < iVar4);
  }
  return iVar3;
}

Assistant:

int divmod_assign(const bigint& divisor) {
    FMT_ASSERT(this != &divisor, "");
    if (compare(*this, divisor) < 0) return 0;
    int num_bigits = static_cast<int>(bigits_.size());
    FMT_ASSERT(divisor.bigits_[divisor.bigits_.size() - 1u] != 0, "");
    int exp_difference = exp_ - divisor.exp_;
    if (exp_difference > 0) {
      // Align bigints by adding trailing zeros to simplify subtraction.
      bigits_.resize(to_unsigned(num_bigits + exp_difference));
      for (int i = num_bigits - 1, j = i + exp_difference; i >= 0; --i, --j)
        bigits_[j] = bigits_[i];
      std::uninitialized_fill_n(bigits_.data(), exp_difference, 0);
      exp_ -= exp_difference;
    }
    int quotient = 0;
    do {
      subtract_aligned(divisor);
      ++quotient;
    } while (compare(*this, divisor) >= 0);
    return quotient;
  }